

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fire.hpp
# Opt level: O0

void fire::_instant_assert(bool pass,string *msg,bool programmer_side)

{
  ulong uVar1;
  ostream *poVar2;
  bool programmer_side_local;
  string *msg_local;
  bool pass_local;
  
  if (pass) {
    return;
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::operator<<((ostream *)&std::cerr,"Error");
    if (programmer_side) {
      std::operator<<((ostream *)&std::cerr," (programmer side)");
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,": ");
    poVar2 = std::operator<<(poVar2,(string *)msg);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  exit(1);
}

Assistant:

void _instant_assert(bool pass, const std::string &msg, bool programmer_side) {
        if (pass)
            return;

        if (!msg.empty()) {
            std::cerr << "Error";
            if(programmer_side)
                std::cerr << " (programmer side)";
            std::cerr << ": " << msg << std::endl;
        }

        exit(_failure_code);
    }